

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.hpp
# Opt level: O3

function<void_(int)> * __thiscall
function<void_(int)>::operator=(function<void_(int)> *this,function<void_(int)> *other)

{
  vtable *pvVar1;
  
  if (this != other) {
    if (this->vtable_ != (vtable *)0x0) {
      (*this->vtable_->destroy)(this);
      this->vtable_ = (vtable *)0x0;
    }
    pvVar1 = other->vtable_;
    this->vtable_ = pvVar1;
    if (pvVar1 != (vtable *)0x0) {
      (*pvVar1->move)(other,this);
      if (other->vtable_ != (vtable *)0x0) {
        (*other->vtable_->destroy)(other);
        other->vtable_ = (vtable *)0x0;
      }
    }
  }
  return this;
}

Assistant:

function<R(Args...)> & function<R(Args...)>::operator = (function && other) noexcept
{
	if (this == &other)
		return *this;

	reset();
	vtable_ = other.vtable_;
	if (vtable_)
		vtable_->move(&other.storage_, &storage_);
	other.reset();
	return *this;
}